

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

int __thiscall
CVmObjFile::getp_read_file(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char cVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  int iVar4;
  
  if (getp_read_file(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_read_file();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_read_file::desc);
  pvVar3 = sp_;
  if (iVar4 == 0) {
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar3->val).obj = self;
    check_valid_file(this);
    if ((this->super_CVmObject).ext_[0x15] == '\x02') {
      CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_mode_exc,0,"wrong file mode");
    }
    switch_read_write_mode(this,0);
    cVar1 = (this->super_CVmObject).ext_[0x14];
    if (cVar1 == '\x03') {
      CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_mode_exc,0,"wrong file mode");
    }
    if (cVar1 == '\x02') {
      read_data_mode(this,retval);
    }
    else if (cVar1 == '\x01') {
      read_text_mode(this,retval);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_read_file(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);

    /* check that we have read access */
    check_read_access(vmg0_);

    /* note the implicit seeking */
    note_file_seek(vmg_ FALSE);

    /* flush stdio buffers as needed and note the read operation */
    switch_read_write_mode(vmg_ FALSE);

    /* read according to our mode */
    switch(get_ext()->mode)
    {
    case VMOBJFILE_MODE_TEXT:
        /* read a line of text */
        read_text_mode(vmg_ retval);
        break;

    case VMOBJFILE_MODE_DATA:
        /* read in data mode */
        read_data_mode(vmg_ retval);
        break;

    case VMOBJFILE_MODE_RAW:
        /* can't use this call on this type of file */
        G_interpreter->throw_new_class(vmg_ G_predef->file_mode_exc,
                                       0, "wrong file mode");
        break;
    }

    /* discard the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}